

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_dec.c
# Opt level: O3

uint8_t * VP8DecompressAlphaRows(VP8Decoder *dec,VP8Io *io,int row,int num_rows)

{
  byte bVar1;
  int stride;
  byte *pbVar2;
  VP8LDecoder *pVVar3;
  int iVar4;
  uint8_t *puVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ALPHDecoder *pAVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  long lVar12;
  VP8StatusCode error;
  int iVar13;
  uint8_t *puVar14;
  ulong uVar15;
  
  iVar7 = io->crop_bottom;
  if (iVar7 < num_rows + row || (num_rows < 1 || row < 0)) {
    return (uint8_t *)0x0;
  }
  stride = io->width;
  if (dec->is_alpha_decoded != 0) goto LAB_0012b05c;
  pAVar9 = dec->alph_dec;
  if (pAVar9 == (ALPHDecoder *)0x0) {
    pAVar9 = (ALPHDecoder *)WebPSafeCalloc(1,0xd8);
    dec->alph_dec = pAVar9;
    if (pAVar9 == (ALPHDecoder *)0x0) {
      VP8SetError(dec,VP8_STATUS_OUT_OF_MEMORY,"Alpha decoder initialization failed.");
      return (uint8_t *)0x0;
    }
    puVar11 = (uint8_t *)WebPSafeMalloc((long)io->crop_bottom * (long)io->width,1);
    dec->alpha_plane_mem = puVar11;
    if (puVar11 == (uint8_t *)0x0) {
      iVar6 = VP8SetError(dec,VP8_STATUS_OUT_OF_MEMORY,"Alpha decoder initialization failed.");
      if (iVar6 == 0) goto LAB_0012b31f;
      puVar11 = dec->alpha_plane;
    }
    else {
      dec->alpha_plane = puVar11;
      dec->alpha_prev_line = (uint8_t *)0x0;
    }
    pAVar9 = dec->alph_dec;
    pbVar2 = dec->alpha_data;
    uVar15 = dec->alpha_data_size;
    VP8FiltersInit();
    pAVar9->output = puVar11;
    iVar6 = io->height;
    pAVar9->width = io->width;
    pAVar9->height = iVar6;
    if (1 < uVar15) {
      bVar1 = *pbVar2;
      pAVar9->method = bVar1 & 3;
      pAVar9->filter = *pbVar2 >> 2 & WEBP_FILTER_GRADIENT;
      uVar8 = *pbVar2 >> 4 & 3;
      pAVar9->pre_processing = uVar8;
      if ((((byte)(bVar1 & 3) < 2) && ((byte)uVar8 < 2)) && (*pbVar2 < 0x40)) {
        iVar6 = VP8InitIoInternal(&pAVar9->io,0x210);
        if (iVar6 != 0) {
          uVar15 = uVar15 - 1;
          WebPInitCustomIo((WebPDecParams *)0x0,&pAVar9->io);
          (pAVar9->io).opaque = pAVar9;
          iVar6 = io->height;
          (pAVar9->io).width = io->width;
          (pAVar9->io).height = iVar6;
          iVar6 = io->crop_left;
          iVar13 = io->crop_right;
          iVar4 = io->crop_top;
          (pAVar9->io).use_cropping = io->use_cropping;
          (pAVar9->io).crop_left = iVar6;
          (pAVar9->io).crop_right = iVar13;
          (pAVar9->io).crop_top = iVar4;
          (pAVar9->io).crop_bottom = io->crop_bottom;
          if (pAVar9->method == 0) {
            uVar8 = (uint)((ulong)((long)pAVar9->height * (long)pAVar9->width) <= uVar15);
          }
          else {
            uVar8 = VP8LDecodeAlphaHeader(pAVar9,pbVar2 + 1,uVar15);
          }
          if (uVar8 != 0) {
            pAVar9 = dec->alph_dec;
            if (pAVar9->pre_processing == 1) {
              num_rows = iVar7 - row;
            }
            else {
              dec->alpha_dithering = 0;
            }
            goto LAB_0012b08a;
          }
        }
      }
    }
    pVVar3 = dec->alph_dec->vp8l_dec;
    if (pVVar3 == (VP8LDecoder *)0x0) {
      error = VP8_STATUS_OUT_OF_MEMORY;
    }
    else {
      error = pVVar3->status;
    }
    VP8SetError(dec,error,"Alpha decoder initialization failed.");
  }
  else {
LAB_0012b08a:
    iVar7 = (pAVar9->io).crop_bottom;
    if (pAVar9->method == 0) {
      puVar11 = dec->alpha_prev_line;
      if (0 < num_rows) {
        iVar6 = pAVar9->width;
        lVar12 = (long)iVar6;
        puVar14 = dec->alpha_data + (long)(iVar6 * row) + 1;
        puVar5 = dec->alpha_plane + iVar6 * row;
        iVar13 = num_rows;
        do {
          puVar10 = puVar5;
          (*WebPUnfilters[pAVar9->filter])(puVar11,puVar14,puVar10,iVar6);
          puVar14 = puVar14 + lVar12;
          iVar13 = iVar13 + -1;
          puVar5 = puVar10 + lVar12;
          puVar11 = puVar10;
        } while (iVar13 != 0);
        puVar11 = puVar10 + lVar12 + -lVar12;
      }
      dec->alpha_prev_line = puVar11;
    }
    else {
      iVar6 = VP8LDecodeAlphaImageStream(pAVar9,num_rows + row);
      if (iVar6 == 0) goto LAB_0012b31f;
    }
    if (num_rows + row < iVar7) {
      if (dec->is_alpha_decoded == 0) goto LAB_0012b05c;
    }
    else {
      dec->is_alpha_decoded = 1;
    }
    ALPHDelete(dec->alph_dec);
    dec->alph_dec = (ALPHDecoder *)0x0;
    if ((dec->alpha_dithering < 1) ||
       (iVar7 = WebPDequantizeLevels
                          (dec->alpha_plane + (long)io->crop_left + (long)(io->crop_top * stride),
                           io->crop_right - io->crop_left,io->crop_bottom - io->crop_top,stride,
                           dec->alpha_dithering), iVar7 != 0)) {
LAB_0012b05c:
      return dec->alpha_plane + stride * row;
    }
  }
LAB_0012b31f:
  WebPSafeFree(dec->alpha_plane_mem);
  dec->alpha_plane_mem = (uint8_t *)0x0;
  dec->alpha_plane = (uint8_t *)0x0;
  ALPHDelete(dec->alph_dec);
  dec->alph_dec = (ALPHDecoder *)0x0;
  return (uint8_t *)0x0;
}

Assistant:

WEBP_NODISCARD const uint8_t* VP8DecompressAlphaRows(VP8Decoder* const dec,
                                                     const VP8Io* const io,
                                                     int row, int num_rows) {
  const int width = io->width;
  const int height = io->crop_bottom;

  assert(dec != NULL && io != NULL);

  if (row < 0 || num_rows <= 0 || row + num_rows > height) {
    return NULL;
  }

  if (!dec->is_alpha_decoded) {
    if (dec->alph_dec == NULL) {    // Initialize decoder.
      dec->alph_dec = ALPHNew();
      if (dec->alph_dec == NULL) {
        VP8SetError(dec, VP8_STATUS_OUT_OF_MEMORY,
                    "Alpha decoder initialization failed.");
        return NULL;
      }
      if (!AllocateAlphaPlane(dec, io)) goto Error;
      if (!ALPHInit(dec->alph_dec, dec->alpha_data, dec->alpha_data_size,
                    io, dec->alpha_plane)) {
        VP8LDecoder* const vp8l_dec = dec->alph_dec->vp8l_dec;
        VP8SetError(dec,
                    (vp8l_dec == NULL) ? VP8_STATUS_OUT_OF_MEMORY
                                       : vp8l_dec->status,
                    "Alpha decoder initialization failed.");
        goto Error;
      }
      // if we allowed use of alpha dithering, check whether it's needed at all
      if (dec->alph_dec->pre_processing != ALPHA_PREPROCESSED_LEVELS) {
        dec->alpha_dithering = 0;    // disable dithering
      } else {
        num_rows = height - row;     // decode everything in one pass
      }
    }

    assert(dec->alph_dec != NULL);
    assert(row + num_rows <= height);
    if (!ALPHDecode(dec, row, num_rows)) goto Error;

    if (dec->is_alpha_decoded) {   // finished?
      ALPHDelete(dec->alph_dec);
      dec->alph_dec = NULL;
      if (dec->alpha_dithering > 0) {
        uint8_t* const alpha = dec->alpha_plane + io->crop_top * width
                             + io->crop_left;
        if (!WebPDequantizeLevels(alpha,
                                  io->crop_right - io->crop_left,
                                  io->crop_bottom - io->crop_top,
                                  width, dec->alpha_dithering)) {
          goto Error;
        }
      }
    }
  }

  // Return a pointer to the current decoded row.
  return dec->alpha_plane + row * width;

 Error:
  WebPDeallocateAlphaMemory(dec);
  return NULL;
}